

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

BlockEntry * __thiscall mkvparser::Segment::GetBlock(Segment *this,CuePoint *cp,TrackPosition *tp)

{
  Cluster **ppCVar1;
  Cluster **ppCVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  longlong lVar5;
  Cluster *pCluster;
  BlockEntry *pBVar6;
  Cluster **ppCVar7;
  long lVar8;
  Cluster **ppCVar9;
  
  ppCVar9 = this->m_clusters;
  ppCVar1 = ppCVar9 + this->m_clusterCount + this->m_clusterPreloadCount;
  ppCVar7 = ppCVar1;
  do {
    while( true ) {
      if (ppCVar7 <= ppCVar9) {
        if (ppCVar9 != ppCVar7) {
          __assert_fail("i == j",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x889,
                        "const BlockEntry *mkvparser::Segment::GetBlock(const CuePoint &, const CuePoint::TrackPosition &)"
                       );
        }
        pCluster = Cluster::Create(this,-1,tp->m_pos);
        if (pCluster != (Cluster *)0x0) {
          lVar8 = (long)ppCVar7 - (long)this->m_clusters;
          bVar4 = PreloadCluster(this,pCluster,lVar8 >> 3);
          if (bVar4) {
            if (this->m_clusters == (Cluster **)0x0) {
              __assert_fail("m_clusters",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                            ,0x896,
                            "const BlockEntry *mkvparser::Segment::GetBlock(const CuePoint &, const CuePoint::TrackPosition &)"
                           );
            }
            if (this->m_clusterPreloadCount < 1) {
              __assert_fail("m_clusterPreloadCount > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                            ,0x897,
                            "const BlockEntry *mkvparser::Segment::GetBlock(const CuePoint &, const CuePoint::TrackPosition &)"
                           );
            }
            if (*(Cluster **)((long)this->m_clusters + lVar8) != pCluster) {
              __assert_fail("m_clusters[idx] == pCluster",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                            ,0x898,
                            "const BlockEntry *mkvparser::Segment::GetBlock(const CuePoint &, const CuePoint::TrackPosition &)"
                           );
            }
            goto LAB_00126613;
          }
          Cluster::~Cluster(pCluster);
          operator_delete(pCluster);
        }
        return (BlockEntry *)0x0;
      }
      auVar3._8_8_ = (long)ppCVar7 - (long)ppCVar9 >> 0x3f;
      auVar3._0_8_ = (long)ppCVar7 - (long)ppCVar9 >> 3;
      ppCVar2 = ppCVar9 + SUB168(auVar3 / SEXT816(2),0);
      if (ppCVar1 <= ppCVar2) {
        __assert_fail("k < jj",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x875,
                      "const BlockEntry *mkvparser::Segment::GetBlock(const CuePoint &, const CuePoint::TrackPosition &)"
                     );
      }
      pCluster = *ppCVar2;
      if (pCluster == (Cluster *)0x0) {
        __assert_fail("pCluster",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x878,
                      "const BlockEntry *mkvparser::Segment::GetBlock(const CuePoint &, const CuePoint::TrackPosition &)"
                     );
      }
      lVar5 = Cluster::GetPosition(pCluster);
      if (tp->m_pos <= lVar5) break;
      ppCVar9 = ppCVar2 + 1;
    }
    ppCVar7 = ppCVar2;
  } while (tp->m_pos < lVar5);
LAB_00126613:
  pBVar6 = Cluster::GetEntry(pCluster,cp,tp);
  return pBVar6;
}

Assistant:

const BlockEntry* Segment::GetBlock(const CuePoint& cp,
                                    const CuePoint::TrackPosition& tp) {
  Cluster** const ii = m_clusters;
  Cluster** i = ii;

  const long count = m_clusterCount + m_clusterPreloadCount;

  Cluster** const jj = ii + count;
  Cluster** j = jj;

  while (i < j) {
    // INVARIANT:
    //[ii, i) < pTP->m_pos
    //[i, j) ?
    //[j, jj)  > pTP->m_pos

    Cluster** const k = i + (j - i) / 2;
    assert(k < jj);

    Cluster* const pCluster = *k;
    assert(pCluster);

    // const long long pos_ = pCluster->m_pos;
    // assert(pos_);
    // const long long pos = pos_ * ((pos_ < 0) ? -1 : 1);

    const long long pos = pCluster->GetPosition();
    assert(pos >= 0);

    if (pos < tp.m_pos)
      i = k + 1;
    else if (pos > tp.m_pos)
      j = k;
    else
      return pCluster->GetEntry(cp, tp);
  }

  assert(i == j);
  // assert(Cluster::HasBlockEntries(this, tp.m_pos));

  Cluster* const pCluster = Cluster::Create(this, -1, tp.m_pos);  //, -1);
  if (pCluster == NULL)
    return NULL;

  const ptrdiff_t idx = i - m_clusters;

  if (!PreloadCluster(pCluster, idx)) {
    delete pCluster;
    return NULL;
  }
  assert(m_clusters);
  assert(m_clusterPreloadCount > 0);
  assert(m_clusters[idx] == pCluster);

  return pCluster->GetEntry(cp, tp);
}